

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

void tree_sitter_gdscript_external_scanner_deserialize(void *payload,char *buffer,uint length)

{
  byte bVar1;
  void *pvVar2;
  uint *puVar3;
  uint uVar4;
  size_t __size;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar4 = 0;
  **(undefined4 **)((long)payload + 8) = 0;
  puVar3 = *payload;
  *puVar3 = 0;
  pvVar2 = *(void **)(puVar3 + 2);
  if (puVar3[1] == 0) {
    pvVar2 = realloc(pvVar2,0x20);
    if (pvVar2 == (void *)0x0) {
      __assert_fail("tmp != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                    ,0x1d3,
                    "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                   );
    }
    puVar3 = *payload;
    *(void **)(puVar3 + 2) = pvVar2;
    uVar4 = *puVar3;
    uVar5 = 0x10;
    if (0x10 < uVar4 * 2) {
      uVar5 = uVar4 * 2;
    }
    puVar3[1] = uVar5;
  }
  *puVar3 = uVar4 + 1;
  *(undefined2 *)((long)pvVar2 + (ulong)uVar4 * 2) = 0;
  if (length != 0) {
    bVar1 = *buffer;
    uVar7 = (ulong)bVar1;
    if (uVar7 == 0) {
      uVar7 = 1;
    }
    else {
      puVar3 = *(uint **)((long)payload + 8);
      pvVar2 = *(void **)(puVar3 + 2);
      if (puVar3[1] < (uint)bVar1) {
        pvVar2 = realloc(pvVar2,uVar7);
        if (pvVar2 == (void *)0x0) {
          __assert_fail("tmp != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                        ,0x1da,
                        "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                       );
        }
        puVar3 = *(uint **)((long)payload + 8);
        *(void **)(puVar3 + 2) = pvVar2;
        puVar3[1] = (uint)bVar1;
      }
      *puVar3 = (uint)bVar1;
      memcpy(pvVar2,buffer + 1,uVar7);
      uVar7 = uVar7 + 1;
    }
    if ((uint)uVar7 < length) {
      puVar3 = *payload;
      uVar4 = *puVar3;
      do {
        pvVar2 = *(void **)(puVar3 + 2);
        if (puVar3[1] == uVar4) {
          __size = (ulong)(uVar4 * 2) * 2;
          if (uVar4 * 2 < 0x10) {
            __size = 0x20;
          }
          pvVar2 = realloc(pvVar2,__size);
          if (pvVar2 == (void *)0x0) {
            __assert_fail("tmp != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                          ,0x1e1,
                          "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                         );
          }
          puVar3 = *payload;
          *(void **)(puVar3 + 2) = pvVar2;
          uVar4 = *puVar3;
          uVar5 = uVar4 * 2;
          if (uVar5 < 0x11) {
            uVar5 = 0x10;
          }
          puVar3[1] = uVar5;
        }
        bVar1 = buffer[uVar7];
        uVar6 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        *puVar3 = uVar4;
        *(ushort *)((long)pvVar2 + uVar6 * 2) = (ushort)bVar1;
        uVar7 = uVar7 + 1;
      } while (length != uVar7);
    }
    else if ((uint)uVar7 != length) {
      __assert_fail("size == length",
                    "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                    ,0x1e4,
                    "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                   );
    }
  }
  return;
}

Assistant:

void tree_sitter_gdscript_external_scanner_deserialize(void *payload,
                                                       const char *buffer,
                                                       unsigned length) {
    Scanner *scanner = (Scanner *)payload;

    VEC_CLEAR(scanner->delimiters);
    VEC_CLEAR(scanner->indents);
    VEC_PUSH(scanner->indents, 0);

    if (length > 0) {
        size_t size = 0;

        size_t delimiter_count = (uint8_t)buffer[size++];
        if (delimiter_count > 0) {
            VEC_GROW(scanner->delimiters, delimiter_count);
            scanner->delimiters->len = delimiter_count;
            memcpy(scanner->delimiters->data, &buffer[size], delimiter_count);
            size += delimiter_count;
        }

        for (; size < length; size++) {
            VEC_PUSH(scanner->indents, (unsigned char)buffer[size]);
        }

        assert(size == length);
    }
}